

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-dice.c
# Opt level: O3

int dice_roll(dice_t *dice,random_value *v)

{
  int iVar1;
  ulong uVar2;
  random_value rv;
  random_value local_28;
  
  dice_random_value(dice,&local_28);
  if (v == (random_value *)0x0) {
    uVar2 = (ulong)(uint)local_28.sides;
  }
  else {
    v->base = local_28.base;
    v->dice = local_28.dice;
    uVar2 = CONCAT44(local_28.m_bonus,local_28.sides);
    v->sides = local_28.sides;
    v->m_bonus = local_28.m_bonus;
  }
  iVar1 = damroll(local_28.dice,(int)uVar2);
  return iVar1 + local_28.base;
}

Assistant:

int dice_roll(const dice_t *dice, random_value *v)
{
	random_value rv;
	dice_random_value(dice, &rv);

	if (v != NULL) {
		v->base = rv.base;
		v->dice = rv.dice;
		v->sides = rv.sides;
		v->m_bonus = rv.m_bonus;
	}

	return rv.base + damroll(rv.dice, rv.sides);
}